

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O1

_Bool run_bitset_container_intersection
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  uint64_t *puVar5;
  int iVar6;
  uint uVar7;
  array_container_t *paVar8;
  bitset_container_t *pbVar9;
  byte bVar10;
  ulong uVar11;
  int32_t iVar12;
  long lVar13;
  uint32_t runValue;
  int iVar14;
  uint uVar15;
  
  if (((src_1->n_runs == 1) && (src_1->runs->value == 0)) && (src_1->runs->length == 0xffff)) {
    if ((bitset_container_t *)*dst == src_2) {
      return true;
    }
    pbVar9 = bitset_container_clone(src_2);
    *dst = pbVar9;
    return true;
  }
  iVar6 = run_container_cardinality(src_1);
  if (iVar6 < 0x1001) {
    iVar14 = src_2->cardinality;
    if (iVar6 < src_2->cardinality) {
      iVar14 = iVar6;
    }
    paVar8 = array_container_create_given_capacity(iVar14);
    *dst = paVar8;
    if ((paVar8 != (array_container_t *)0x0) && (iVar6 = src_1->n_runs, 0 < (long)iVar6)) {
      prVar3 = src_1->runs;
      puVar4 = paVar8->array;
      puVar5 = src_2->words;
      iVar12 = paVar8->cardinality;
      lVar13 = 0;
      do {
        uVar11 = (ulong)prVar3[lVar13].value;
        iVar14 = prVar3[lVar13].length + 1;
        do {
          puVar4[iVar12] = (uint16_t)uVar11;
          iVar12 = iVar12 + (uint)((*(ulong *)((long)puVar5 + (ulong)((uint)(uVar11 >> 3) & 0x1ff8))
                                    >> (uVar11 & 0x3f) & 1) != 0);
          uVar11 = (ulong)((int)uVar11 + 1);
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
        lVar13 = lVar13 + 1;
      } while (lVar13 != iVar6);
      paVar8->cardinality = iVar12;
    }
  }
  else {
    pbVar9 = (bitset_container_t *)*dst;
    if (pbVar9 == src_2) {
      iVar6 = src_1->n_runs;
      if ((long)iVar6 < 1) {
        uVar15 = 0;
      }
      else {
        prVar3 = src_1->runs;
        puVar5 = src_2->words;
        lVar13 = 0;
        uVar15 = 0;
        do {
          uVar1 = prVar3[lVar13].value;
          uVar2 = prVar3[lVar13].length;
          if (uVar15 != uVar1) {
            uVar7 = uVar15 >> 6;
            uVar11 = -1L << ((byte)uVar15 & 0x3f);
            uVar15 = uVar1 - 1 >> 6;
            if (uVar15 - uVar7 == 0) {
              bVar10 = -(char)uVar1;
              uVar11 = (uVar11 << (bVar10 & 0x3f)) >> (bVar10 & 0x3f);
              uVar15 = uVar7;
            }
            else {
              puVar5[uVar7] = puVar5[uVar7] & ~uVar11;
              if (uVar7 + 1 < uVar15) {
                memset(puVar5 + (ulong)uVar7 + 1,0,(ulong)((uVar15 - uVar7) - 2) * 8 + 8);
              }
              uVar11 = 0xffffffffffffffff >> (-(char)uVar1 & 0x3fU);
            }
            puVar5[uVar15] = puVar5[uVar15] & ~uVar11;
          }
          uVar15 = (uint)uVar1 + (uint)uVar2 + 1;
          lVar13 = lVar13 + 1;
        } while (iVar6 != lVar13);
      }
      if (uVar15 != 0x10000) {
        puVar5 = src_2->words;
        uVar7 = uVar15 >> 6;
        puVar5[uVar7] = puVar5[uVar7] & ~(-1L << ((byte)uVar15 & 0x3f));
        if (uVar7 != 0x3ff) {
          if (uVar15 < 0xff80) {
            memset((void *)((long)puVar5 + (ulong)(uVar15 >> 3 & 0x1ff8) + 8),0,
                   (ulong)(0x3fd - uVar7) * 8 + 8);
          }
          puVar5[0x3ff] = 0;
        }
      }
      iVar6 = bitset_container_compute_cardinality(pbVar9);
      pbVar9->cardinality = iVar6;
      if (0x1000 < src_2->cardinality) {
        return 0x1000 < src_2->cardinality;
      }
      paVar8 = array_container_from_bitset(src_2);
      *dst = paVar8;
    }
    else {
      pbVar9 = bitset_container_clone(src_2);
      *dst = pbVar9;
      if (pbVar9 == (bitset_container_t *)0x0) {
        return true;
      }
      iVar6 = src_1->n_runs;
      if ((long)iVar6 < 1) {
        uVar15 = 0;
      }
      else {
        prVar3 = src_1->runs;
        puVar5 = pbVar9->words;
        lVar13 = 0;
        uVar15 = 0;
        do {
          uVar1 = prVar3[lVar13].value;
          uVar2 = prVar3[lVar13].length;
          if (uVar15 != uVar1) {
            uVar7 = uVar15 >> 6;
            uVar11 = -1L << ((byte)uVar15 & 0x3f);
            uVar15 = uVar1 - 1 >> 6;
            if (uVar15 - uVar7 == 0) {
              bVar10 = -(char)uVar1;
              uVar11 = (uVar11 << (bVar10 & 0x3f)) >> (bVar10 & 0x3f);
              uVar15 = uVar7;
            }
            else {
              puVar5[uVar7] = puVar5[uVar7] & ~uVar11;
              if (uVar7 + 1 < uVar15) {
                memset(puVar5 + (ulong)uVar7 + 1,0,(ulong)((uVar15 - uVar7) - 2) * 8 + 8);
              }
              uVar11 = 0xffffffffffffffff >> (-(char)uVar1 & 0x3fU);
            }
            puVar5[uVar15] = puVar5[uVar15] & ~uVar11;
          }
          uVar15 = (uint)uVar1 + (uint)uVar2 + 1;
          lVar13 = lVar13 + 1;
        } while (iVar6 != lVar13);
      }
      if (uVar15 != 0x10000) {
        puVar5 = pbVar9->words;
        uVar7 = uVar15 >> 6;
        puVar5[uVar7] = puVar5[uVar7] & ~(-1L << ((byte)uVar15 & 0x3f));
        if (uVar7 != 0x3ff) {
          if (uVar15 < 0xff80) {
            memset((void *)((long)puVar5 + (ulong)(uVar15 >> 3 & 0x1ff8) + 8),0,
                   (ulong)(0x3fd - uVar7) * 8 + 8);
          }
          puVar5[0x3ff] = 0;
        }
      }
      iVar6 = bitset_container_compute_cardinality(pbVar9);
      pbVar9->cardinality = iVar6;
      if (0x1000 < iVar6) {
        return 0x1000 < iVar6;
      }
      paVar8 = array_container_from_bitset(pbVar9);
      bitset_container_free((bitset_container_t *)*dst);
      *dst = paVar8;
    }
  }
  return false;
}

Assistant:

bool run_bitset_container_intersection(const run_container_t *src_1,
                                       const bitset_container_t *src_2,
                                       container_t **dst) {
    if (run_container_is_full(src_1)) {
        if (*dst != src_2) *dst = bitset_container_clone(src_2);
        return true;
    }
    int32_t card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // result can only be an array (assuming that we never make a
        // RunContainer)
        if (card > src_2->cardinality) {
            card = src_2->cardinality;
        }
        array_container_t *answer = array_container_create_given_capacity(card);
        *dst = answer;
        if (*dst == NULL) {
            return false;
        }
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            uint32_t endofrun = (uint32_t)rle.value + rle.length;
            for (uint32_t runValue = rle.value; runValue <= endofrun;
                 ++runValue) {
                answer->array[answer->cardinality] = (uint16_t)runValue;
                answer->cardinality +=
                    bitset_container_contains(src_2, runValue);
            }
        }
        return false;
    }
    if (*dst == src_2) {  // we attempt in-place
        bitset_container_t *answer = CAST_bitset(*dst);
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(src_2->words, start, end);

            start = end + rle.length + 1;
        }
        bitset_reset_range(src_2->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);
        if (src_2->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(src_2);
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    } else {  // no inplace
        // we expect the answer to be a bitmap (if we are lucky)
        bitset_container_t *answer = bitset_container_clone(src_2);

        *dst = answer;
        if (answer == NULL) {
            return true;
        }
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(answer->words, start, end);
            start = end + rle.length + 1;
        }
        bitset_reset_range(answer->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(answer);
            bitset_container_free(CAST_bitset(*dst));
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    }
}